

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  bool bVar1;
  char *str;
  char *in_RDX;
  Int32 IVar2;
  ostream *poVar3;
  undefined1 local_70 [8];
  string env_var;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  Int32 local_24 [2];
  Int32 result;
  
  FlagToEnvVar_abi_cxx11_((string *)local_70,(internal *)flag,in_RDX);
  str = getenv((char *)local_70);
  IVar2 = default_value;
  if (str != (char *)0x0) {
    local_24[0] = default_value;
    Message::Message((Message *)((long)&env_var.field_2 + 8));
    poVar3 = (ostream *)(env_var.field_2._8_8_ + 0x10);
    std::operator<<(poVar3,"Environment variable ");
    std::operator<<(poVar3,(string *)local_70);
    bVar1 = ParseInt32((Message *)((long)&env_var.field_2 + 8),str,local_24);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&env_var.field_2 + 8));
    IVar2 = local_24[0];
    if (!bVar1) {
      Message::Message((Message *)&local_30);
      std::ostream::operator<<(local_30.ptr_ + 0x10,default_value);
      StringStreamToString((string *)((long)&env_var.field_2 + 8),local_30.ptr_);
      printf("The default value %s is used.\n",env_var.field_2._8_8_);
      std::__cxx11::string::~string((string *)(env_var.field_2._M_local_buf + 8));
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_30);
      fflush(_stdout);
      IVar2 = default_value;
    }
  }
  std::__cxx11::string::~string((string *)local_70);
  return IVar2;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
#if defined(GTEST_GET_INT32_FROM_ENV_)
  return GTEST_GET_INT32_FROM_ENV_(flag, default_value);
#endif  // defined(GTEST_GET_INT32_FROM_ENV_)
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
}